

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  byte bVar1;
  IRIns IVar2;
  RegSet RVar3;
  int iVar4;
  uint uVar5;
  Reg rb;
  byte *pbVar6;
  byte *local_60;
  x86Op local_54;
  x86Op xo;
  Reg left;
  IRRef tmp;
  MCode *q;
  MCode *p;
  uint local_30;
  int32_t k;
  Reg right;
  Reg dest;
  RegSet allow;
  IRRef rref;
  IRRef lref;
  x86Arith xa_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  allow = (RegSet)(ir->field_0).op1;
  dest = (Reg)(ir->field_0).op2;
  right = 0xbfef;
  p._4_4_ = 0;
  if (as->flagmcp == as->mcp) {
    iVar4 = 2;
    if (*as->mcp < 0x84) {
      iVar4 = 3;
    }
    pbVar6 = as->mcp + iVar4;
    local_60 = pbVar6;
    if (*pbVar6 == 0xf) {
      local_60 = pbVar6 + 1;
    }
    if ((*local_60 & 0xf) < 0xe) {
      if (0xb < (*local_60 & 0xf)) {
        *local_60 = *local_60 - 4;
      }
      as->flagmcp = (MCode *)0x0;
      as->mcp = pbVar6;
    }
  }
  bVar1 = *(byte *)((long)as->ir + (ulong)dest * 8 + 6);
  local_30 = (uint)bVar1;
  if ((bVar1 & 0x80) == 0) {
    right = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & 0xbfef;
    as->weakset = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & as->weakset;
  }
  rref = xa;
  _lref = ir;
  ir_local = (IRIns *)as;
  k = ra_dest(as,ir,right);
  uVar5 = k;
  if (((allow != dest) && (uVar5 = local_30, (local_30 & 0x80) != 0)) &&
     (iVar4 = asm_isk32((ASMState *)&ir_local->field_0,dest,(int32_t *)((long)&p + 4)),
     uVar5 = local_30, iVar4 == 0)) {
    iVar4 = asm_swapops((ASMState *)&ir_local->field_0,_lref);
    RVar3 = allow;
    if (iVar4 != 0) {
      allow = dest;
      dest = RVar3;
    }
    right = (1 << ((byte)k & 0x1f) ^ 0xffffffffU) & right;
    uVar5 = asm_fuseloadm((ASMState *)&ir_local->field_0,dest,right,
                          0x605fd9U >> ((_lref->field_1).t.irt & 0x1f) & 1);
  }
  local_30 = uVar5;
  if (((_lref->field_1).t.irt & 0x80) != 0) {
    asm_guardcc((ASMState *)&ir_local->field_0,0);
  }
  if (rref == 8) {
    if ((local_30 & 0x80) != 0) {
      rb = asm_fuseloadm((ASMState *)&ir_local->field_0,allow,0xbfef,
                         0x605fd9U >> ((_lref->field_1).t.irt & 0x1f) & 1);
      if (p._4_4_ == (char)p._4_4_) {
        IVar2 = ir_local[0x10];
        ir_local[0x10] = (IRIns)(IVar2.field_0 + -1);
        *(char *)((long)IVar2 + -1) = (char)p._4_4_;
        local_54 = XO_IMULi8;
      }
      else {
        *(int32_t *)((long)ir_local[0x10] + -4) = p._4_4_;
        ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
        local_54 = XO_IMULi;
      }
      iVar4 = 0;
      if ((0x605fd9U >> ((_lref->field_1).t.irt & 0x1f) & 1) != 0) {
        iVar4 = 0x80200;
      }
      emit_mrm((ASMState *)&ir_local->field_0,local_54,k + iVar4,rb);
      return;
    }
    iVar4 = 0;
    if ((0x605fd9U >> ((_lref->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar4 = 0x80200;
    }
    emit_mrm((ASMState *)&ir_local->field_0,XO_IMUL,k + iVar4,local_30);
  }
  else if ((local_30 & 0x80) == 0) {
    iVar4 = 0;
    if ((0x605fd9U >> ((_lref->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar4 = 0x80200;
    }
    emit_mrm((ASMState *)&ir_local->field_0,rref * 0x8000000 + 0x30000fe,k + iVar4,local_30);
  }
  else {
    iVar4 = 0;
    if ((0x605fd9U >> ((_lref->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar4 = 0x80200;
    }
    emit_gri((ASMState *)&ir_local->field_0,rref + 0x838100,k + iVar4,p._4_4_);
  }
  ra_left((ASMState *)&ir_local->field_0,k,allow);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    MCode *q = p[0] == 0x0f ? p+1 : p;
    if ((*q & 15) < 14) {
      if ((*q & 15) >= 12) *q -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}